

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O0

BOOL optimize_class_chars
               (compiler_common *common,sljit_u8 *bits,BOOL nclass,BOOL invert,
               jump_list **backtracks)

{
  sljit_compiler *compiler_00;
  sljit_s32 sVar1;
  uint uVar2;
  sljit_jump *jump;
  int local_54;
  int c;
  int len;
  int k;
  int j;
  int i;
  sljit_s32 type;
  uint8_t byte;
  sljit_compiler *psStack_38;
  uint16_t char_list [3];
  sljit_compiler *compiler;
  jump_list **backtracks_local;
  BOOL invert_local;
  BOOL nclass_local;
  sljit_u8 *bits_local;
  compiler_common *common_local;
  
  psStack_38 = common->compiler;
  sVar1 = sljit_has_cpu_feature(3);
  if (sVar1 == 0) {
    common_local._4_4_ = 0;
  }
  else {
    backtracks_local._4_4_ = nclass;
    if (invert != 0) {
      backtracks_local._4_4_ = (uint)((nclass != 0 ^ 0xffU) & 1);
    }
    local_54 = 0;
    for (k = 0; k < 0x20; k = k + 1) {
      i._1_1_ = bits[k];
      if (backtracks_local._4_4_ != 0) {
        i._1_1_ = i._1_1_ ^ 0xff;
      }
      len = 0;
      for (; i._1_1_ != 0; i._1_1_ = (byte)((int)(uint)i._1_1_ >> 1)) {
        if ((i._1_1_ & 1) != 0) {
          uVar2 = k * 8 + len;
          c = local_54;
          if ((uVar2 & 0x20) != 0) {
            for (c = 0; c < local_54; c = c + 1) {
              if ((uint)*(ushort *)((long)&i + (long)c * 2 + 2) == uVar2 - 0x20) {
                *(ushort *)((long)&i + (long)c * 2 + 2) =
                     *(ushort *)((long)&i + (long)c * 2 + 2) | 0x120;
                break;
              }
            }
          }
          if (c == local_54) {
            if (2 < local_54) {
              return 0;
            }
            *(short *)((long)&i + (long)local_54 * 2 + 2) = (short)uVar2;
            local_54 = local_54 + 1;
          }
        }
        len = len + 1;
      }
    }
    if (local_54 == 0) {
      common_local._4_4_ = 0;
    }
    else {
      len = 0;
      if (i._2_2_ != 0) {
        sljit_emit_op1(psStack_38,0x20,4,0,0x40,0);
      }
      else {
        sljit_emit_op2(psStack_38,0x262,0,0,1,0,0x40,0);
        sljit_emit_op_flags(psStack_38,0x20,4,0,0);
      }
      for (k = (int)(i._2_2_ == 0); k < local_54; k = k + 1) {
        if ((*(ushort *)((long)&i + (long)k * 2 + 2) & 0x100) == 0) {
          sljit_emit_op2(psStack_38,0x262,0,0,1,0,0x40,
                         (ulong)*(ushort *)((long)&i + (long)k * 2 + 2));
          sljit_emit_cmov(psStack_38,0,4,1,0);
        }
        else {
          len = len + 1;
        }
      }
      if (len != 0) {
        sljit_emit_op2(psStack_38,0x66,1,0,1,0,0x40,0x20);
        for (k = 0; k < local_54; k = k + 1) {
          if ((*(ushort *)((long)&i + (long)k * 2 + 2) & 0x100) != 0) {
            sljit_emit_op2(psStack_38,0x262,0,0,1,0,0x40,
                           (long)(int)(*(ushort *)((long)&i + (long)k * 2 + 2) & 0xff));
            sljit_emit_cmov(psStack_38,0,4,1,0);
          }
        }
      }
      compiler_00 = psStack_38;
      jump = sljit_emit_cmp(psStack_38,(uint)(backtracks_local._4_4_ != 0),4,0,0x40,0);
      add_jump(compiler_00,backtracks,jump);
      common_local._4_4_ = 1;
    }
  }
  return common_local._4_4_;
}

Assistant:

static BOOL optimize_class_chars(compiler_common *common, const sljit_u8 *bits, BOOL nclass, BOOL invert, jump_list **backtracks)
{
/* May destroy TMP1. */
DEFINE_COMPILER;
uint16_t char_list[MAX_CLASS_CHARS_SIZE];
uint8_t byte;
sljit_s32 type;
int i, j, k, len, c;

if (!sljit_has_cpu_feature(SLJIT_HAS_CMOV))
  return FALSE;

if (invert)
  nclass = !nclass;

len = 0;

for (i = 0; i < 32; i++)
  {
  byte = bits[i];

  if (nclass)
    byte = ~byte;

  j = 0;
  while (byte != 0)
    {
    if (byte & 0x1)
      {
      c = i * 8 + j;

      k = len;

      if ((c & 0x20) != 0)
        {
        for (k = 0; k < len; k++)
          if (char_list[k] == c - 0x20)
            {
            char_list[k] |= 0x120;
            break;
            }
        }

      if (k == len)
        {
        if (len >= MAX_CLASS_CHARS_SIZE)
          return FALSE;

        char_list[len++] = (uint16_t) c;
        }
      }

    byte >>= 1;
    j++;
    }
  }

if (len == 0) return FALSE;  /* Should never occur, but stops analyzers complaining. */

i = 0;
j = 0;

if (char_list[0] == 0)
  {
  i++;
  OP2(SLJIT_SUB | SLJIT_SET_Z, SLJIT_UNUSED, 0, TMP1, 0, SLJIT_IMM, 0);
  OP_FLAGS(SLJIT_MOV, TMP2, 0, SLJIT_ZERO);
  }
else
  OP1(SLJIT_MOV, TMP2, 0, SLJIT_IMM, 0);

while (i < len)
  {
  if ((char_list[i] & 0x100) != 0)
    j++;
  else
    {
    OP2(SLJIT_SUB | SLJIT_SET_Z, SLJIT_UNUSED, 0, TMP1, 0, SLJIT_IMM, char_list[i]);
    CMOV(SLJIT_ZERO, TMP2, TMP1, 0);
    }
  i++;
  }

if (j != 0)
  {
  OP2(SLJIT_OR, TMP1, 0, TMP1, 0, SLJIT_IMM, 0x20);

  for (i = 0; i < len; i++)
    if ((char_list[i] & 0x100) != 0)
      {
      j--;
      OP2(SLJIT_SUB | SLJIT_SET_Z, SLJIT_UNUSED, 0, TMP1, 0, SLJIT_IMM, char_list[i] & 0xff);
      CMOV(SLJIT_ZERO, TMP2, TMP1, 0);
      }
  }

type = nclass ? SLJIT_NOT_EQUAL : SLJIT_EQUAL;
add_jump(compiler, backtracks, CMP(type, TMP2, 0, SLJIT_IMM, 0));
return TRUE;
}